

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

char * ps_get_kws(ps_decoder_t *ps,char *name)

{
  int iVar1;
  ps_search_t *search_00;
  ps_search_t *search;
  char *name_local;
  ps_decoder_t *ps_local;
  
  search_00 = ps_find_search(ps,name);
  if (search_00 == (ps_search_t *)0x0) {
    ps_local = (ps_decoder_t *)0x0;
  }
  else {
    iVar1 = strcmp("kws",search_00->type);
    if (iVar1 == 0) {
      ps_local = (ps_decoder_t *)kws_search_get_keyphrases(search_00);
    }
    else {
      ps_local = (ps_decoder_t *)0x0;
    }
  }
  return (char *)ps_local;
}

Assistant:

const char*
ps_get_kws(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search = ps_find_search(ps, name);
    if (search == NULL)
        return NULL;
    if (0 != strcmp(PS_SEARCH_TYPE_KWS, ps_search_type(search)))
        return NULL;
    return kws_search_get_keyphrases(search);
}